

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsResub.c
# Opt level: O0

int Abc_NtkMfsTryResubOnce(Mfs_Man_t *p,int *pCands,int nCands)

{
  int iVar1;
  uint *p_00;
  int local_40;
  int i;
  int iVar;
  int RetValue2;
  int RetValue;
  uint *pData;
  int fVeryVerbose;
  int nCands_local;
  int *pCands_local;
  Mfs_Man_t *p_local;
  
  p->nSatCalls = p->nSatCalls + 1;
  iVar1 = sat_solver_solve(p->pSat,pCands,pCands + nCands,(long)p->pPars->nBTLimit,0,0,0);
  if (iVar1 == -1) {
    p_local._4_4_ = 1;
  }
  else if (iVar1 == 1) {
    p->nSatCexes = p->nSatCexes + 1;
    for (local_40 = 0; iVar1 = Vec_IntSize(p->vProjVarsSat), local_40 < iVar1;
        local_40 = local_40 + 1) {
      iVar1 = Vec_IntEntry(p->vProjVarsSat,local_40);
      p_00 = (uint *)Vec_PtrEntry(p->vDivCexes,local_40);
      iVar1 = sat_solver_var_value(p->pSat,iVar1);
      if (iVar1 == 0) {
        iVar1 = Abc_InfoHasBit(p_00,p->nCexes);
        if (iVar1 == 0) {
          __assert_fail("Abc_InfoHasBit(pData, p->nCexes)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/mfs/mfsResub.c"
                        ,0x91,"int Abc_NtkMfsTryResubOnce(Mfs_Man_t *, int *, int)");
        }
        Abc_InfoXorBit(p_00,p->nCexes);
      }
    }
    p->nCexes = p->nCexes + 1;
    p_local._4_4_ = 0;
  }
  else {
    p->nTimeOuts = p->nTimeOuts + 1;
    p_local._4_4_ = -1;
  }
  return p_local._4_4_;
}

Assistant:

int Abc_NtkMfsTryResubOnce( Mfs_Man_t * p, int * pCands, int nCands )
{
    int fVeryVerbose = 0;
    unsigned * pData;
    int RetValue, RetValue2 = -1, iVar, i;//, clk = Abc_Clock();
/*
    if ( p->pPars->fGiaSat )
    {
        RetValue2 = Abc_NtkMfsTryResubOnceGia( p, pCands, nCands );
p->timeGia += Abc_Clock() - clk;
        return RetValue2;
    }
*/ 
    p->nSatCalls++;
    RetValue = sat_solver_solve( p->pSat, pCands, pCands + nCands, (ABC_INT64_T)p->pPars->nBTLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
//    assert( RetValue == l_False || RetValue == l_True );

    if ( RetValue != l_Undef && RetValue2 != -1 )
    {
        assert( (RetValue == l_False) == (RetValue2 == 1) );
    }

    if ( RetValue == l_False )
    {
        if ( fVeryVerbose )
        printf( "U " );
        return 1;
    }
    if ( RetValue != l_True )
    {
        if ( fVeryVerbose )
        printf( "T " );
        p->nTimeOuts++;
        return -1;
    }
    if ( fVeryVerbose )
    printf( "S " );
    p->nSatCexes++;
    // store the counter-example
    Vec_IntForEachEntry( p->vProjVarsSat, iVar, i )
    {
        pData = (unsigned *)Vec_PtrEntry( p->vDivCexes, i );
        if ( !sat_solver_var_value( p->pSat, iVar ) ) // remove 0s!!!
        {
            assert( Abc_InfoHasBit(pData, p->nCexes) );
            Abc_InfoXorBit( pData, p->nCexes );
        }
    }
    p->nCexes++;
    return 0;

}